

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void variance_double_1_suite::test_ctor(void)

{
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined8 local_78;
  value_type local_70;
  undefined4 local_64;
  size_type local_60;
  undefined1 local_52;
  undefined1 local_51 [2];
  undefined1 local_4f;
  undefined1 local_4e [2];
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  moment_variance<double,_1> filter;
  
  trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_48[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::capacity
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.capacity()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e2,"void variance_double_1_suite::test_ctor()",local_48,&local_4c);
  local_4e[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::empty
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_4f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","true",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e3,"void variance_double_1_suite::test_ctor()",local_4e,&local_4f);
  local_51[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::full
                          ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_52 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e4,"void variance_double_1_suite::test_ctor()",local_51,&local_52);
  local_60 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::size
                       ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_64 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e5,"void variance_double_1_suite::test_ctor()",&local_60,&local_64);
  local_70 = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)1>::mean
                       ((basic_moment<double,_1UL,_(trial::online::with)1> *)local_38);
  local_78 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e6,"void variance_double_1_suite::test_ctor()",&local_70,&local_78);
  local_88[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::variance
                          ((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e7,"void variance_double_1_suite::test_ctor()",local_88,&local_90);
  local_a0[0] = trial::online::window::basic_moment<double,_1UL,_(trial::online::with)2>::
                unbiased_variance((basic_moment<double,_1UL,_(trial::online::with)2> *)local_38);
  local_a8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x1e8,"void variance_double_1_suite::test_ctor()",local_a0,&local_a8);
  return;
}

Assistant:

void test_ctor()
{
    window::moment_variance<double, 1> filter;
    TRIAL_TEST_EQ(filter.capacity(), 1);
    TRIAL_TEST_EQ(filter.empty(), true);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 0);
    TRIAL_TEST_EQ(filter.mean(), 0.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
}